

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

Vec_Int_t *
Wlc_NtkDeriveFirstTotal
          (Wlc_Ntk_t *p,Vec_Int_t *vMemObjs,Vec_Int_t *vMemFanins,int iFirstMemPi,int iFirstMemCi,
          int fVerbose)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pWVar3;
  Wlc_Obj_t *p_01;
  char *pcVar4;
  int local_58;
  int nMemFanins;
  int iFanin;
  int k;
  int i;
  Wlc_Obj_t *pFanin;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vFirstTotal;
  int local_28;
  int fVerbose_local;
  int iFirstMemCi_local;
  int iFirstMemPi_local;
  Vec_Int_t *vMemFanins_local;
  Vec_Int_t *vMemObjs_local;
  Wlc_Ntk_t *p_local;
  
  iVar1 = Vec_IntSize(vMemObjs);
  p_00 = Vec_IntStart(iVar1 * 3);
  local_58 = 0;
  local_28 = iFirstMemCi;
  fVerbose_local = iFirstMemPi;
  for (iFanin = 0; iVar1 = Vec_IntSize(vMemObjs), iFanin < iVar1; iFanin = iFanin + 1) {
    iVar1 = Vec_IntEntry(vMemObjs,iFanin);
    pWVar3 = Wlc_NtkObj(p,iVar1);
    iVar1 = Wlc_ObjType(pWVar3);
    if (iVar1 == 8) {
      pWVar3 = Wlc_ObjFanin0(p,pWVar3);
      iVar1 = Wlc_ObjRange(pWVar3);
      if (iVar1 != 1) {
        __assert_fail("Wlc_ObjRange(pFanin) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                      ,0x2a8,
                      "Vec_Int_t *Wlc_NtkDeriveFirstTotal(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                     );
      }
      uVar2 = Wlc_ObjRange(pWVar3);
      Vec_IntWriteEntry(p_00,iFanin * 3,local_28 << 10 | uVar2);
      iVar1 = Wlc_ObjRange(pWVar3);
      local_28 = iVar1 + local_28;
      local_58 = local_58 + 1;
    }
    else {
      iVar1 = Wlc_ObjType(pWVar3);
      if ((iVar1 == 0x36) || (iVar1 = Wlc_ObjType(pWVar3), iVar1 == 0x37)) {
        for (nMemFanins = 0; iVar1 = Wlc_ObjFaninNum(pWVar3), nMemFanins < iVar1;
            nMemFanins = nMemFanins + 1) {
          iVar1 = Wlc_ObjFaninId(pWVar3,nMemFanins);
          if (0 < nMemFanins) {
            p_01 = Wlc_NtkObj(p,iVar1);
            uVar2 = Wlc_ObjRange(p_01);
            Vec_IntWriteEntry(p_00,iFanin * 3 + nMemFanins,local_28 << 10 | uVar2);
            iVar1 = Wlc_ObjRange(p_01);
            local_28 = iVar1 + local_28;
            local_58 = local_58 + 1;
          }
        }
        iVar1 = Wlc_ObjType(pWVar3);
        if (iVar1 == 0x36) {
          uVar2 = Wlc_ObjRange(pWVar3);
          Vec_IntWriteEntry(p_00,iFanin * 3 + 2,fVerbose_local << 10 | uVar2);
          iVar1 = Wlc_ObjRange(pWVar3);
          fVerbose_local = iVar1 + fVerbose_local;
        }
      }
    }
  }
  iVar1 = Vec_IntSize(vMemFanins);
  if (local_58 == iVar1) {
    if (fVerbose != 0) {
      for (iFanin = 0; iVar1 = Vec_IntSize(p_00), iFanin < iVar1; iFanin = iFanin + 1) {
        uVar2 = Vec_IntEntry(p_00,iFanin);
        printf("Obj %5d  Fanin %5d : ",(long)iFanin / 3 & 0xffffffff,(long)iFanin % 3 & 0xffffffff);
        iVar1 = Vec_IntEntry(vMemObjs,iFanin / 3);
        pcVar4 = Wlc_ObjName(p,iVar1);
        printf("%16s : %d(%d)\n",pcVar4,(ulong)(uint)((int)uVar2 >> 10),(ulong)(uVar2 & 0x3ff));
      }
    }
    return p_00;
  }
  __assert_fail("nMemFanins == Vec_IntSize(vMemFanins)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                ,0x2bf,
                "Vec_Int_t *Wlc_NtkDeriveFirstTotal(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
               );
}

Assistant:

Vec_Int_t * Wlc_NtkDeriveFirstTotal( Wlc_Ntk_t * p, Vec_Int_t * vMemObjs, Vec_Int_t * vMemFanins, int iFirstMemPi, int iFirstMemCi, int fVerbose )
{
    Vec_Int_t * vFirstTotal = Vec_IntStart( 3 * Vec_IntSize(vMemObjs) ); // contains pairs of (first CO bit: range) for each input/output of a node
    Wlc_Obj_t * pObj, * pFanin; int i, k, iFanin, nMemFanins = 0;
    Wlc_NtkForEachObjVec( vMemObjs, p, pObj, i )
    {
        if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
        {
            //Vec_IntPush( vMemFanins, Wlc_ObjFaninId0(pObj) );
            pFanin = Wlc_ObjFanin0(p, pObj);
            assert( Wlc_ObjRange(pFanin) == 1 );
            Vec_IntWriteEntry( vFirstTotal, 3*i, (iFirstMemCi << 10) | Wlc_ObjRange(pFanin) );
            iFirstMemCi += Wlc_ObjRange(pFanin);
            nMemFanins++;
        }
        else if ( Wlc_ObjType(pObj) == WLC_OBJ_READ || Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
        {
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                if ( k > 0 )
                {
                    //Vec_IntPush( vMemFanins, iFanin );
                    pFanin = Wlc_NtkObj(p, iFanin);
                    Vec_IntWriteEntry( vFirstTotal, 3*i + k, (iFirstMemCi << 10) | Wlc_ObjRange(pFanin) );
                    iFirstMemCi += Wlc_ObjRange(pFanin);
                    nMemFanins++;
                }
            if ( Wlc_ObjType(pObj) == WLC_OBJ_READ )
            {
                Vec_IntWriteEntry( vFirstTotal, 3*i + 2, (iFirstMemPi << 10) | Wlc_ObjRange(pObj) );
                iFirstMemPi += Wlc_ObjRange(pObj);
            }
        }
    }
    assert( nMemFanins == Vec_IntSize(vMemFanins) );
    if ( fVerbose )
    Vec_IntForEachEntry( vFirstTotal, iFanin, i )
    {
        printf( "Obj %5d  Fanin %5d : ", i/3, i%3 );
        printf( "%16s : %d(%d)\n", Wlc_ObjName(p, Vec_IntEntry(vMemObjs, i/3)), iFanin >> 10, iFanin & 0x3FF );
    }
    return vFirstTotal;
}